

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcDataStream::write_prop_id(CTcDataStream *this,uint prop_id)

{
  ulong uVar1;
  undefined8 in_RAX;
  CTcIdFixup *pCVar2;
  CTcIdFixup **in_RCX;
  uint16_t tmp;
  char buf [2];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (G_keep_propfixups != 0) {
    uVar1 = this->ofs_;
    pCVar2 = (CTcIdFixup *)CTcPrsMem::alloc(G_prsmem,0x20);
    pCVar2->ds_ = this;
    pCVar2->ofs_ = uVar1;
    pCVar2->id_ = (ulong)prop_id;
    pCVar2->nxt_ = (CTcIdFixup *)0x0;
    in_RCX = &G_propfixup;
    pCVar2->nxt_ = G_propfixup;
    G_propfixup = pCVar2;
  }
  uStack_28 = CONCAT26((short)prop_id,(undefined6)uStack_28);
  write(this,(int)&uStack_28 + 6,(void *)0x2,(size_t)in_RCX);
  return;
}

Assistant:

void CTcDataStream::write_prop_id(uint prop_id)
{
    /* if there's an object ID fixup list, add this reference */
    if (G_keep_propfixups)
        CTcIdFixup::add_fixup(&G_propfixup, this, get_ofs(), prop_id);

    /* write the ID */
    write2(prop_id);
}